

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::copy
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  DefinitionSymbol *pDVar2;
  ConfigRule *pCVar3;
  SourceLocation SVar4;
  byte *pbVar5;
  byte *pbVar6;
  pointer pTVar7;
  byte *pbVar8;
  pointer pTVar9;
  byte *pbVar10;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar8 = pbVar5 + sVar1 * 0x20;
  if (*(byte **)(dst + 8) < pbVar8) {
    pbVar6 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x20,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_0043b204;
    pTVar7 = this->data_;
    pTVar9 = pTVar7 + sVar1;
    pbVar8 = pbVar6 + sVar1 * 0x20;
    pbVar5 = pbVar6;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar8;
    pTVar7 = this->data_;
    pTVar9 = pTVar7 + sVar1;
    pbVar6 = pbVar5;
  }
  do {
    pbVar10 = pbVar5 + 0x20;
    pDVar2 = pTVar7->definition;
    pCVar3 = pTVar7->rule;
    SVar4 = (pTVar7->sourceRange).endLoc;
    *(SourceLocation *)(pbVar5 + 0x10) = (pTVar7->sourceRange).startLoc;
    *(SourceLocation *)(pbVar5 + 0x18) = SVar4;
    *(DefinitionSymbol **)pbVar5 = pDVar2;
    *(ConfigRule **)(pbVar5 + 8) = pCVar3;
    if (pTVar7 + 1 == pTVar9) break;
    pTVar7 = pTVar7 + 1;
    pbVar5 = pbVar10;
  } while (pbVar10 != pbVar8);
LAB_0043b204:
  return (int)pbVar6;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }